

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O3

Image * Image_Function_Helper::Threshold
                  (Image *__return_storage_ptr__,ThresholdDoubleForm4 threshold,Image *in,
                  uint8_t minThreshold,uint8_t maxThreshold)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x01','\x01');
  (*threshold)(in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
               __return_storage_ptr__->_height,minThreshold,maxThreshold);
  return __return_storage_ptr__;
}

Assistant:

Image Threshold( FunctionTable::ThresholdDoubleForm4 threshold,
                     const Image & in, uint8_t minThreshold, uint8_t maxThreshold )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        threshold( in, 0, 0, out, 0, 0, out.width(), out.height(), minThreshold, maxThreshold );

        return out;
    }